

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_rorl_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  byte bVar2;
  uint32_t n_local;
  uint64_t x_local;
  CPUARMState *env_local;
  
  bVar2 = (byte)n;
  uVar1 = (x & 0xffffffff) >> (bVar2 & 0x3f) | x >> (bVar2 & 0x3f) & 0xffffffff00000000 |
          x << (0x20 - bVar2 & 0x3f) & 0xffffffff |
          (x & 0xffffffff00000000) << (0x20 - bVar2 & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)((uVar1 & 0x80000000) != 0) << 0xf | (uint)((uVar1 & 0xffffffff) == 0) << 0xe |
       (uint)((uVar1 >> 0x20 & 0x80000000) != 0) << 0x1f | (uint)(uVar1 >> 0x20 == 0) << 0x1e;
  return uVar1;
}

Assistant:

uint64_t HELPER(iwmmxt_rorl)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((x & (0xffffffffll << 0)) >> n) |
        ((x >> n) & (0xffffffffll << 32)) |
        ((x << (32 - n)) & (0xffffffffll << 0)) |
        ((x & (0xffffffffll << 32)) << (32 - n));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}